

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O0

int __thiscall
smf::Binasc::processMidiPitchBendWord(Binasc *this,ostream *out,string *word,int lineNum)

{
  int iVar1;
  ulong uVar2;
  ostream *poVar3;
  char *pcVar4;
  uchar MSB;
  uchar LSB;
  double dStack_38;
  int intval;
  double value;
  int lineNum_local;
  string *word_local;
  ostream *out_local;
  Binasc *this_local;
  
  uVar2 = std::__cxx11::string::size();
  if (uVar2 < 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error on line: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,lineNum);
    poVar3 = std::operator<<(poVar3,": \'p\' needs to be followed immediately by ");
    poVar3 = std::operator<<(poVar3,"a floating-point number");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = 0;
  }
  else {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)word);
    iVar1 = isdigit((int)*pcVar4);
    if ((((iVar1 == 0) &&
         (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)word), *pcVar4 != '.')) &&
        (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)word), *pcVar4 != '-')) &&
       (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)word), *pcVar4 != '+')) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error on line: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,lineNum);
      poVar3 = std::operator<<(poVar3,": \'p\' needs to be followed immediately by ");
      poVar3 = std::operator<<(poVar3,"a floating-point number");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return 0;
    }
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)word);
    dStack_38 = strtod(pcVar4,(char **)0x0);
    if (1.0 < dStack_38) {
      dStack_38 = 1.0;
    }
    if (dStack_38 < -1.0) {
      dStack_38 = -1.0;
    }
    iVar1 = (int)((dStack_38 + 1.0) * 8191.5 + 0.5);
    poVar3 = std::operator<<(out,(byte)iVar1 & 0x7f);
    std::operator<<(poVar3,(byte)(iVar1 >> 7) & 0x7f);
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Binasc::processMidiPitchBendWord(std::ostream& out, const std::string& word,
		int lineNum) {
	if (word.size() < 2) {
		std::cerr << "Error on line: " << lineNum
			  << ": 'p' needs to be followed immediately by "
			  << "a floating-point number" << std::endl;
		return 0;
	}
	if (!(isdigit(word[1]) || word[1] == '.' || word[1] == '-'
			|| word[1] == '+')) {
		std::cerr << "Error on line: " << lineNum
			  << ": 'p' needs to be followed immediately by "
			  << "a floating-point number" << std::endl;
		return 0;
	}
	double value = strtod(&word[1], NULL);

	if (value > 1.0) {
		value = 1.0;
	}
	if (value < -1.0) {
		value = -1.0;
	}

	int intval = (int)(((1 << 13)-0.5)  * (value + 1.0) + 0.5);
	uchar LSB = intval & 0x7f;
	uchar MSB = (intval >>  7) & 0x7f;
	out << LSB << MSB;
	return 1;
}